

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

SequenceReset *
anon_unknown.dwarf_52c65e::createSequenceReset
          (SequenceReset *__return_storage_ptr__,char *sender,char *target,int seq,int newSeq)

{
  undefined1 *this;
  int iVar1;
  SequenceReset *extraout_RAX;
  FieldBase local_70;
  
  FIX42::SequenceReset::SequenceReset(__return_storage_ptr__);
  FIX::UInt64Field::UInt64Field((UInt64Field *)&local_70,0x24,(ulong)target & 0xffffffff);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003277f8;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)&local_70,9,iVar1);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_70,10,iVar1);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325560;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  return extraout_RAX;
}

Assistant:

FIX42::SequenceReset createSequenceReset(const char *sender, const char *target, int seq, int newSeq) {
  FIX42::SequenceReset sequenceReset;
  sequenceReset.set(NewSeqNo(newSeq));
  fillHeader(sequenceReset.getHeader(), sender, target, seq);
  sequenceReset.getHeader().setField(BodyLength(sequenceReset.bodyLength()));
  sequenceReset.getTrailer().setField(CheckSum(sequenceReset.checkSum()));
  return sequenceReset;
}